

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

string * __thiscall
CppGenerator::updateRanges
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_t sVar7;
  long *plVar8;
  ulong *puVar9;
  size_type *psVar10;
  char cVar11;
  CppGenerator *this_00;
  undefined8 uVar12;
  ulong uVar13;
  string depthString;
  ulong *local_450;
  long local_448;
  ulong local_440;
  undefined4 uStack_438;
  undefined4 uStack_434;
  ulong *local_430;
  long local_428;
  ulong local_420;
  long lStack_418;
  ulong *local_410;
  long local_408;
  ulong local_400;
  long lStack_3f8;
  char *local_3f0;
  uint local_3e8;
  char local_3e0 [16];
  ulong *local_3d0;
  long local_3c8;
  ulong local_3c0 [2];
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  ulong *local_310;
  long local_308;
  ulong local_300 [2];
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0 [2];
  string local_2d0;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  long *local_270;
  long local_268;
  long local_260;
  long lStack_258;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  cVar11 = '\x01';
  if (9 < depth) {
    sVar7 = depth;
    cVar4 = '\x04';
    do {
      cVar11 = cVar4;
      if (sVar7 < 100) {
        cVar11 = cVar11 + -2;
        goto LAB_00282bd2;
      }
      if (sVar7 < 1000) {
        cVar11 = cVar11 + -1;
        goto LAB_00282bd2;
      }
      if (sVar7 < 10000) goto LAB_00282bd2;
      bVar2 = 99999 < sVar7;
      sVar7 = sVar7 / 10000;
      cVar4 = cVar11 + '\x04';
    } while (bVar2);
    cVar11 = cVar11 + '\x01';
  }
LAB_00282bd2:
  local_3f0 = local_3e0;
  std::__cxx11::string::_M_construct((ulong)&local_3f0,cVar11);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_3f0,local_3e8,depth);
  cVar11 = (char)depth * '\x03' + '\t';
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct((ulong)local_b0,cVar11);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_b0);
  local_2b0 = &local_2a0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_2a0 = *plVar8;
    lStack_298 = plVar5[3];
  }
  else {
    local_2a0 = *plVar8;
    local_2b0 = (long *)*plVar5;
  }
  local_2a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2b0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_290 = &local_280;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_280 = *plVar8;
    lStack_278 = plVar5[3];
  }
  else {
    local_280 = *plVar8;
    local_290 = (long *)*plVar5;
  }
  local_288 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270 = &local_260;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_260 = *plVar8;
    lStack_258 = plVar5[3];
  }
  else {
    local_260 = *plVar8;
    local_270 = (long *)*plVar5;
  }
  local_268 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_3f0);
  local_250 = &local_240;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_240 = *plVar8;
    lStack_238 = plVar5[3];
  }
  else {
    local_240 = *plVar8;
    local_250 = (long *)*plVar5;
  }
  local_248 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_250);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_440 = *puVar9;
    uStack_438 = (undefined4)plVar5[3];
    uStack_434 = *(undefined4 *)((long)plVar5 + 0x1c);
    local_450 = &local_440;
  }
  else {
    local_440 = *puVar9;
    local_450 = (ulong *)*plVar5;
  }
  local_448 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  this_00 = (CppGenerator *)(rel_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,this_00,
             (pointer)((long)&(this_00->super_CodeGenerator)._vptr_CodeGenerator +
                      rel_name->_M_string_length));
  getUpperPointer(&local_2d0,this_00,&local_d0,depth,parallel);
  uVar13 = 0xf;
  if (local_450 != &local_440) {
    uVar13 = local_440;
  }
  if (uVar13 < local_2d0._M_string_length + local_448) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar12 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_2d0._M_string_length + local_448) goto LAB_00282e96;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2d0,0,(char *)0x0,(ulong)local_450);
  }
  else {
LAB_00282e96:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_450,(ulong)local_2d0._M_dataplus._M_p);
  }
  local_3b0 = &local_3a0;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_3a0 = *puVar1;
    uStack_398 = puVar6[3];
  }
  else {
    local_3a0 = *puVar1;
    local_3b0 = (undefined8 *)*puVar6;
  }
  local_3a8 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_3b0);
  local_230 = &local_220;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_220 = *plVar8;
    lStack_218 = plVar5[3];
  }
  else {
    local_220 = *plVar8;
    local_230 = (long *)*plVar5;
  }
  local_228 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_230,(ulong)(rel_name->_M_dataplus)._M_p);
  local_210 = &local_200;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_200 = *plVar8;
    lStack_1f8 = plVar5[3];
  }
  else {
    local_200 = *plVar8;
    local_210 = (long *)*plVar5;
  }
  local_208 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_210);
  local_1f0 = &local_1e0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1e0 = *plVar8;
    lStack_1d8 = plVar5[3];
  }
  else {
    local_1e0 = *plVar8;
    local_1f0 = (long *)*plVar5;
  }
  local_1e8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1f0,(ulong)(rel_name->_M_dataplus)._M_p);
  local_1d0 = &local_1c0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1c0 = *plVar8;
    lStack_1b8 = plVar5[3];
  }
  else {
    local_1c0 = *plVar8;
    local_1d0 = (long *)*plVar5;
  }
  local_1c8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1b0 = &local_1a0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_1a0 = *plVar8;
    lStack_198 = plVar5[3];
  }
  else {
    local_1a0 = *plVar8;
    local_1b0 = (long *)*plVar5;
  }
  local_1a8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_3f0);
  local_190 = &local_180;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_180 = *plVar8;
    lStack_178 = plVar5[3];
  }
  else {
    local_180 = *plVar8;
    local_190 = (long *)*plVar5;
  }
  local_188 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_190);
  local_170 = &local_160;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_160 = *plVar8;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar8;
    local_170 = (long *)*plVar5;
  }
  local_168 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_170,(ulong)(attr_name->_M_dataplus)._M_p);
  local_150 = &local_140;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_140 = *plVar8;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar8;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_130 = &local_120;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_120 = *plVar8;
    lStack_118 = plVar5[3];
  }
  else {
    local_120 = *plVar8;
    local_130 = (long *)*plVar5;
  }
  local_128 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)(attr_name->_M_dataplus)._M_p);
  local_110 = &local_100;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_100 = *plVar8;
    lStack_f8 = plVar5[3];
  }
  else {
    local_100 = *plVar8;
    local_110 = (long *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_420 = *puVar9;
    lStack_418 = plVar5[3];
    local_430 = &local_420;
  }
  else {
    local_420 = *puVar9;
    local_430 = (ulong *)*plVar5;
  }
  local_428 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_3d0 = local_3c0;
  std::__cxx11::string::_M_construct((ulong)&local_3d0,cVar11);
  uVar13 = 0xf;
  if (local_430 != &local_420) {
    uVar13 = local_420;
  }
  if (uVar13 < (ulong)(local_3c8 + local_428)) {
    uVar13 = 0xf;
    if (local_3d0 != local_3c0) {
      uVar13 = local_3c0[0];
    }
    if (uVar13 < (ulong)(local_3c8 + local_428)) goto LAB_002833a3;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,(ulong)local_430);
  }
  else {
LAB_002833a3:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_3d0);
  }
  local_390 = &local_380;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_380 = *puVar1;
    uStack_378 = puVar6[3];
  }
  else {
    local_380 = *puVar1;
    local_390 = (undefined8 *)*puVar6;
  }
  local_388 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_390);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_400 = *puVar9;
    lStack_3f8 = plVar5[3];
    local_410 = &local_400;
  }
  else {
    local_400 = *puVar9;
    local_410 = (ulong *)*plVar5;
  }
  local_408 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_2f0 = local_2e0;
  std::__cxx11::string::_M_construct((ulong)&local_2f0,(char)depth * '\x03' + '\f');
  uVar13 = 0xf;
  if (local_410 != &local_400) {
    uVar13 = local_400;
  }
  if (uVar13 < (ulong)(local_2e8 + local_408)) {
    uVar13 = 0xf;
    if (local_2f0 != local_2e0) {
      uVar13 = local_2e0[0];
    }
    if (uVar13 < (ulong)(local_2e8 + local_408)) goto LAB_002834df;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,(ulong)local_410);
  }
  else {
LAB_002834df:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_410,(ulong)local_2f0);
  }
  local_370 = &local_360;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_360 = *puVar1;
    uStack_358 = puVar6[3];
  }
  else {
    local_360 = *puVar1;
    local_370 = (undefined8 *)*puVar6;
  }
  local_368 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_370);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(rel_name->_M_dataplus)._M_p);
  local_f0 = &local_e0;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_e0 = *plVar8;
    lStack_d8 = plVar5[3];
  }
  else {
    local_e0 = *plVar8;
    local_f0 = (long *)*plVar5;
  }
  local_e8 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_60 = *plVar8;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar8;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_3f0);
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_40 = *plVar8;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar8;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_320 = *puVar9;
    lStack_318 = plVar5[3];
    local_330 = &local_320;
  }
  else {
    local_320 = *puVar9;
    local_330 = (ulong *)*plVar5;
  }
  local_328 = plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_310 = local_300;
  std::__cxx11::string::_M_construct((ulong)&local_310,cVar11);
  uVar13 = 0xf;
  if (local_330 != &local_320) {
    uVar13 = local_320;
  }
  if (uVar13 < (ulong)(local_308 + local_328)) {
    uVar13 = 0xf;
    if (local_310 != local_300) {
      uVar13 = local_300[0];
    }
    if ((ulong)(local_308 + local_328) <= uVar13) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_310,0,(char *)0x0,(ulong)local_330);
      goto LAB_002837e9;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_310);
LAB_002837e9:
  local_350 = &local_340;
  puVar1 = puVar6 + 2;
  if ((undefined8 *)*puVar6 == puVar1) {
    local_340 = *puVar1;
    uStack_338 = puVar6[3];
  }
  else {
    local_340 = *puVar1;
    local_350 = (undefined8 *)*puVar6;
  }
  local_348 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_350);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar10 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar10) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar10;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_350 != &local_340) {
    operator_delete(local_350);
  }
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370);
  }
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390);
  }
  if (local_3d0 != local_3c0) {
    operator_delete(local_3d0);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270);
  }
  if (local_290 != &local_280) {
    operator_delete(local_290);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_3f0 != local_3e0) {
    operator_delete(local_3f0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::updateRanges(size_t depth, const std::string& rel_name,
                                       const std::string& attr_name, bool parallel)
{
    std::string depthString = std::to_string(depth);
    return offset(3+depth)+
        //while statementnd
        "while(upperptr_"+rel_name+"["+depthString+"]<"+
        getUpperPointer(rel_name, depth, parallel)+" && "+
        rel_name+"[upperptr_"+rel_name+"["+depthString+"]+1]."+
        attr_name+" == max_"+attr_name+")\n"+
        //body
        offset(3+depth)+"{\n"+
        offset(4+depth)+"++upperptr_"+rel_name+"["+depthString+"];\n"+
        offset(3+depth)+"}\n";
}